

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O3

Function * __thiscall
wasm::Module::addFunction
          (Module *this,unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *curr)

{
  Function *pFVar1;
  string local_40;
  _Head_base<0UL,_wasm::Function_*,_false> local_20;
  
  local_20._M_head_impl =
       (curr->_M_t).super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
       .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
       super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
  (curr->_M_t).super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl = (Function *)0x0;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"addFunction","");
  pFVar1 = addModuleElement<std::vector<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>,std::allocator<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>>>,std::unordered_map<wasm::Name,wasm::Function*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Function*>>>,wasm::Function>
                     (&this->functions,&this->functionsMap,
                      (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&local_20,
                      &local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
            ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&local_20);
  return pFVar1;
}

Assistant:

Function* Module::addFunction(std::unique_ptr<Function>&& curr) {
  return addModuleElement(
    functions, functionsMap, std::move(curr), "addFunction");
}